

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDepends.cxx
# Opt level: O2

bool __thiscall
cmDepends::Check(cmDepends *this,string *makeFile,string *internalFile,DependencyMap *validDeps)

{
  int iVar1;
  bool bVar2;
  ifstream fin;
  byte abStack_218 [488];
  
  std::ifstream::ifstream(&fin,(internalFile->_M_dataplus)._M_p,_S_in);
  if ((abStack_218[*(long *)(_fin + -0x18)] & 5) == 0) {
    iVar1 = (*this->_vptr_cmDepends[3])(this,&fin,internalFile,validDeps);
    bVar2 = true;
    if ((char)iVar1 != '\0') goto LAB_0030e57d;
  }
  Clear(this,makeFile);
  cmsys::SystemTools::RemoveFile(internalFile);
  cmFileTimeCache::Remove(this->FileTimeCache,internalFile);
  bVar2 = false;
LAB_0030e57d:
  std::ifstream::~ifstream(&fin);
  return bVar2;
}

Assistant:

bool cmDepends::Check(const std::string& makeFile,
                      const std::string& internalFile,
                      DependencyMap& validDeps)
{
  // Check whether dependencies must be regenerated.
  bool okay = true;
  cmsys::ifstream fin(internalFile.c_str());
  if (!(fin && this->CheckDependencies(fin, internalFile, validDeps))) {
    // Clear all dependencies so they will be regenerated.
    this->Clear(makeFile);
    cmSystemTools::RemoveFile(internalFile);
    this->FileTimeCache->Remove(internalFile);
    okay = false;
  }
  return okay;
}